

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O2

void new_line(size_t **line_starts,size_t **line_lengths,size_t *n_lines,size_t *cur_line,
             size_t start,size_t len)

{
  size_t *psVar1;
  size_t sVar2;
  
  sVar2 = *cur_line;
  if (sVar2 == *n_lines) {
    *n_lines = sVar2 + 0x18;
    psVar1 = (size_t *)mem_realloc(*line_starts,sVar2 * 8 + 0xc0);
    *line_starts = psVar1;
    psVar1 = (size_t *)mem_realloc(*line_lengths,*n_lines << 3);
    *line_lengths = psVar1;
    sVar2 = *cur_line;
  }
  else {
    psVar1 = *line_lengths;
  }
  (*line_starts)[sVar2] = start;
  psVar1[*cur_line] = 0;
  *cur_line = *cur_line + 1;
  return;
}

Assistant:

static void new_line(size_t **line_starts, size_t **line_lengths,
		size_t *n_lines, size_t *cur_line,
		size_t start, size_t len)
{
	if (*cur_line == *n_lines) {
		/* this number is not arbitrary: it's the height of a "standard" term */
		(*n_lines) += 24;

		*line_starts = mem_realloc(*line_starts,
				*n_lines * sizeof **line_starts);
		*line_lengths = mem_realloc(*line_lengths,
				*n_lines * sizeof **line_lengths);
	}

	(*line_starts)[*cur_line] = start;
	(*line_lengths)[*cur_line] = len;

	(*cur_line)++;
}